

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarType.hpp
# Opt level: O3

void __thiscall
glu::decl::DeclareStructType::DeclareStructType
          (DeclareStructType *this,StructType *structType_,int indentLevel_)

{
  pointer pcVar1;
  
  (this->structType).m_typeName._M_dataplus._M_p = (pointer)&(this->structType).m_typeName.field_2;
  pcVar1 = (structType_->m_typeName)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (structType_->m_typeName)._M_string_length);
  std::vector<glu::StructMember,_std::allocator<glu::StructMember>_>::vector
            (&(this->structType).m_members,&structType_->m_members);
  this->indentLevel = indentLevel_;
  return;
}

Assistant:

DeclareStructType (const StructType& structType_, int indentLevel_) : structType(structType_), indentLevel(indentLevel_) {}